

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O2

void __thiscall soplex::SVSetBase<double>::ensureMem(SVSetBase<double> *this,int n,bool shortenLast)

{
  DLPSV *pDVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  DLPSV *ps;
  
  iVar4 = (this->super_ClassArray<soplex::Nonzero<double>_>).thesize;
  iVar3 = (this->super_ClassArray<soplex::Nonzero<double>_>).themax;
  iVar2 = iVar4 + n;
  if (iVar3 < iVar2) {
    pDVar1 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last;
    if (shortenLast && pDVar1 != (DLPSV *)0x0) {
      iVar2 = (pDVar1->super_SVectorBase<double>).memused;
      iVar3 = (pDVar1->super_SVectorBase<double>).memsize - iVar2;
      (this->super_ClassArray<soplex::Nonzero<double>_>).thesize = iVar4 - iVar3;
      (pDVar1->super_SVectorBase<double>).memsize = iVar2;
      updateUnusedMemEstimation(this,-iVar3);
      iVar3 = (this->super_ClassArray<soplex::Nonzero<double>_>).themax;
      iVar2 = (this->super_ClassArray<soplex::Nonzero<double>_>).thesize + n;
    }
    if (((0 < iVar2 - iVar3) && (iVar2 - iVar3 <= this->unusedMem)) &&
       ((double)iVar3 * ((this->super_ClassArray<soplex::Nonzero<double>_>).memFactor + -1.0) <
        (double)this->unusedMem)) {
      memPack(this);
      iVar3 = (this->super_ClassArray<soplex::Nonzero<double>_>).themax;
      iVar2 = n + (this->super_ClassArray<soplex::Nonzero<double>_>).thesize;
    }
    if (iVar3 < iVar2) {
      iVar4 = (int)((double)iVar3 * (this->super_ClassArray<soplex::Nonzero<double>_>).memFactor);
      if (iVar4 < iVar2) {
        iVar4 = iVar2;
      }
      memRemax(this,iVar4);
      return;
    }
  }
  return;
}

Assistant:

void ensureMem(int n, bool shortenLast = true)
   {
      if(memSize() + n <= memMax())
         return;

      if(list.last() && shortenLast)
      {
         // get last vector and compute its unused memory
         DLPSV* ps = list.last();
         int unusedPsMem = ps->max() - ps->size();
         assert(unusedPsMem >= 0);

         // return vector's unused memory to common memory
         SVSetBaseArray::removeLast(unusedPsMem);
         ps->set_max(ps->size());

         // decrease counter of unused memory
#ifdef SOPLEX_DEBUG
         SPxOut::debug(this, "ensureMem, this = {} : updateUnusedMemEstimation -= {}\n", (void*)this,
                       unusedPsMem);
#endif
         updateUnusedMemEstimation(-unusedPsMem);
      }

      // if the missing memory can be acquired by packing the memory, we prefer this to allocating new memory
      int missingMem = (memSize() + n - memMax());

      ///@todo use an independent parameter "memwastefactor" here
      if(missingMem > 0 && missingMem <= unusedMem
            && unusedMem > (SVSetBaseArray::memFactor - 1.0) * memMax())
         memPack();

      // if the unused memory was overestimated and packing did not help, we need to reallocate
      if(memSize() + n > memMax())
      {
         int newMax = int(SVSetBaseArray::memFactor * memMax());

         if(memSize() + n > newMax)
            newMax = memSize() + n;

         memRemax(newMax);
      }
   }